

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_rec rf_image_alpha_border(rf_image image,float threshold)

{
  int iVar1;
  rf_color rVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  rf_int x;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  float fVar11;
  undefined8 uVar12;
  float fVar13;
  rf_rec rVar14;
  uint local_84;
  
  if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
    iVar1 = rf_bytes_per_pixel(image.format);
    uVar3 = 0;
    uVar6 = (long)image.width;
    if ((long)image.width < 1) {
      uVar6 = uVar3;
    }
    if (image.height < 1) {
      image.height = 0;
    }
    uVar9 = 0x10000;
    local_84 = 0;
    uVar5 = 0;
    iVar7 = 0x10000;
    for (uVar10 = 0; uVar10 != (uint)image.height; uVar10 = uVar10 + 1) {
      uVar4 = uVar3;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        rVar2 = rf_format_one_pixel_to_rgba32
                          ((void *)((long)(int)uVar4 + (long)image.data),image.format);
        if (((int)(threshold * 255.0) & 0xffU) < (uint)rVar2 >> 0x18) {
          if ((long)uVar8 < (long)iVar7) {
            iVar7 = (int)uVar8;
          }
          if (uVar5 < uVar8) {
            uVar5 = uVar8 & 0xffffffff;
          }
          if ((long)uVar10 < (long)(int)uVar9) {
            uVar9 = (uint)uVar10;
          }
          if (local_84 < uVar10) {
            local_84 = (uint)uVar10;
          }
        }
        uVar4 = (ulong)(uint)((int)uVar4 + iVar1);
      }
      uVar3 = (ulong)(uint)((int)uVar3 + image.width * iVar1);
    }
    fVar11 = (float)iVar7;
    fVar13 = (float)(int)uVar9;
    uVar12 = CONCAT44((float)(int)((local_84 - uVar9) + 1),(float)(((int)uVar5 - iVar7) + 1));
  }
  else {
    rf_log_impl(8,0x172b00,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_alpha_border";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3c36;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
    fVar11 = 0.0;
    fVar13 = 0.0;
    uVar12 = 0;
  }
  rVar14.y = fVar13;
  rVar14.x = fVar11;
  rVar14.width = (float)(int)uVar12;
  rVar14.height = (float)(int)((ulong)uVar12 >> 0x20);
  return rVar14;
}

Assistant:

RF_API rf_rec rf_image_alpha_border(rf_image image, float threshold)
{
    rf_rec crop = {0};

    if (rf_is_uncompressed_format(image.format))
    {
        int x_min = 65536; // Define a big enough number
        int x_max = 0;
        int y_min = 65536;
        int y_max = 0;

        int src_bpp = rf_bytes_per_pixel(image.format);
        int src_size = rf_image_size(image);
        unsigned char* src = image.data;

        for (rf_int y = 0; y < image.height; y++)
        {
            for (rf_int x = 0; x < image.width; x++)
            {
                int src_pos = (y * image.width + x) * src_bpp;

                rf_color rgba32_pixel = rf_format_one_pixel_to_rgba32(&src[src_pos], image.format);

                if (rgba32_pixel.a > (unsigned char)(threshold * 255.0f))
                {
                    if (x < x_min) x_min = x;
                    if (x > x_max) x_max = x;
                    if (y < y_min) y_min = y;
                    if (y > y_max) y_max = y;
                }
            }
        }

        crop = (rf_rec) { x_min, y_min, (x_max + 1) - x_min, (y_max + 1) - y_min };
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);

    return crop;
}